

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int integrityCheckResultRow(Vdbe *v)

{
  int iVar1;
  
  sqlite3VdbeAddOp3(v,0x54,3,1,0);
  iVar1 = sqlite3VdbeAddOp3(v,0x32,1,v->nOp + 2,1);
  sqlite3VdbeAddOp3(v,0x46,0,0,0);
  return iVar1;
}

Assistant:

static int integrityCheckResultRow(Vdbe *v){
  int addr;
  sqlite3VdbeAddOp2(v, OP_ResultRow, 3, 1);
  addr = sqlite3VdbeAddOp3(v, OP_IfPos, 1, sqlite3VdbeCurrentAddr(v)+2, 1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp0(v, OP_Halt);
  return addr;
}